

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O1

data_ptr_t __thiscall
duckdb::TupleDataAllocator::GetBaseHeapPointer
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkPart *part)

{
  BufferHandle *pBVar1;
  
  pBVar1 = PinHeapBlock(this,pin_state,part);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar1->node);
  return ((pBVar1->node).ptr)->buffer;
}

Assistant:

data_ptr_t TupleDataAllocator::GetBaseHeapPointer(TupleDataPinState &pin_state, const TupleDataChunkPart &part) {
	return PinHeapBlock(pin_state, part).Ptr();
}